

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reddit.h
# Opt level: O2

vector<Comment,_std::allocator<Comment>_> * __thiscall
Reddit::requestNewComments
          (vector<Comment,_std::allocator<Comment>_> *__return_storage_ptr__,Reddit *this)

{
  pointer pCVar1;
  __normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_> __last;
  pointer pCVar2;
  vector<Comment,_std::allocator<Comment>_> allComments;
  vector<Comment,_std::allocator<Comment>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  requestComments(&local_60,this);
  __last = std::
           __partition<__gnu_cxx::__normal_iterator<Comment*,std::vector<Comment,std::allocator<Comment>>>,Reddit::requestNewComments()::_lambda(Comment_const&)_1_>
                     (local_60.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      local_60.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
                      super__Vector_impl_data._M_finish,this);
  (__return_storage_ptr__->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__copy_move<true,false,std::random_access_iterator_tag>::
  __copy_m<Comment*,std::back_insert_iterator<std::vector<Comment,std::allocator<Comment>>>>
            (local_60.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
             super__Vector_impl_data._M_start,__last._M_current,
             (back_insert_iterator<std::vector<Comment,_std::allocator<Comment>_>_>)
             __return_storage_ptr__);
  pCVar1 = (__return_storage_ptr__->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar2 = (__return_storage_ptr__->super__Vector_base<Comment,_std::allocator<Comment>_>).
                _M_impl.super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
    std::__cxx11::string::string((string *)&local_48,(string *)pCVar2);
    Cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::add
              (&this->commentCache,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::vector<Comment,_std::allocator<Comment>_>::~vector(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Comment> requestNewComments() {
			std::vector<Comment> allComments = requestComments();

			const auto pos = std::partition(allComments.begin(), allComments.end(), [&](const Comment& c) {
				return (c.author != "std_bot") and !commentCache.isKnown(c.id);
			});

			std::vector<Comment> filteredComments;
			std::move(allComments.begin(), pos, std::back_inserter(filteredComments));

			for (const Comment& comment : filteredComments) {
				commentCache.add(comment.id);
			}

			return filteredComments;
		}